

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

roaring_bitmap_t *
roaring_bitmap_flip_closed(roaring_bitmap_t *x1,uint32_t range_start,uint32_t range_end)

{
  ushort uVar1;
  uint16_t *puVar2;
  rle16_t *prVar3;
  _Bool _Var4;
  uint8_t uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  roaring_bitmap_t *prVar9;
  roaring_array_t *ra;
  run_container_t *c;
  uint16_t lb_start;
  uint16_t stopping_key;
  uint16_t hb;
  uint8_t uVar10;
  uint uVar11;
  run_container_t *run;
  array_container_t *src;
  uint uVar12;
  uint uVar13;
  ushort key;
  uint uVar14;
  bool bVar15;
  run_container_t *local_40;
  uint local_34;
  
  if (range_end < range_start) {
    prVar9 = roaring_bitmap_copy(x1);
    return prVar9;
  }
  ra = &roaring_bitmap_create_with_capacity(0)->high_low_container;
  ra->flags = ra->flags & 0xfe | (x1->high_low_container).flags & 1;
  uVar14 = range_start >> 0x10;
  hb = (uint16_t)(range_end >> 0x10);
  stopping_key = (uint16_t)(range_start >> 0x10);
  ra_append_copies_until
            (ra,&x1->high_low_container,stopping_key,(_Bool)((x1->high_low_container).flags & 1));
  lb_start = (uint16_t)range_start;
  if (uVar14 == range_end >> 0x10) {
    insert_flipped_container(ra,&x1->high_low_container,stopping_key,lb_start,(uint16_t)range_end);
  }
  else {
    if (lb_start != 0) {
      insert_flipped_container(ra,&x1->high_low_container,stopping_key,lb_start,0xffff);
      uVar14 = uVar14 + 1 & 0xffff;
    }
    local_34 = (range_end >> 0x10) - (uint)((range_end & 0xffff) != 0xffff);
    hb = (uint16_t)local_34;
    local_34 = local_34 & 0xffff;
    if (uVar14 <= local_34) {
      do {
        iVar8 = (x1->high_low_container).size;
        key = (ushort)uVar14;
        if (((long)iVar8 == 0) ||
           (puVar2 = (x1->high_low_container).keys, puVar2[(long)iVar8 + -1] == key)) {
          uVar6 = iVar8 - 1;
        }
        else {
          uVar7 = iVar8 - 1;
          uVar11 = 0;
          uVar12 = uVar7;
          do {
            if ((int)uVar7 < (int)uVar11) {
              uVar6 = ~uVar11;
              break;
            }
            uVar6 = uVar11 + uVar7 >> 1;
            uVar1 = *(ushort *)((long)puVar2 + (ulong)(uVar11 + uVar7 & 0xfffffffe));
            if (uVar1 < key) {
              uVar11 = uVar6 + 1;
              bVar15 = true;
              uVar6 = uVar12;
            }
            else if (key < uVar1) {
              uVar7 = uVar6 - 1;
              bVar15 = true;
              uVar6 = uVar12;
            }
            else {
              bVar15 = false;
            }
            uVar12 = uVar6;
          } while (bVar15);
        }
        iVar8 = ra->size;
        if (((long)iVar8 == 0) || (ra->keys[(long)iVar8 + -1] == key)) {
          uVar12 = iVar8 - 1;
        }
        else {
          uVar13 = iVar8 - 1;
          uVar11 = 0;
          uVar7 = uVar13;
          do {
            if ((int)uVar13 < (int)uVar11) {
              uVar12 = ~uVar11;
              break;
            }
            uVar12 = uVar11 + uVar13 >> 1;
            uVar1 = *(ushort *)((long)ra->keys + (ulong)(uVar11 + uVar13 & 0xfffffffe));
            if (uVar1 < key) {
              uVar11 = uVar12 + 1;
              bVar15 = true;
              uVar12 = uVar7;
            }
            else if (key < uVar1) {
              uVar13 = uVar12 - 1;
              bVar15 = true;
              uVar12 = uVar7;
            }
            else {
              bVar15 = false;
            }
            uVar7 = uVar12;
          } while (bVar15);
        }
        if ((int)uVar6 < 0) {
          c = run_container_create_given_capacity(1);
          if (c != (run_container_t *)0x0) {
            prVar3 = c->runs;
            iVar8 = c->n_runs;
            prVar3[iVar8].value = 0;
            prVar3[iVar8].length = 0xffff;
            c->n_runs = c->n_runs + 1;
          }
          uVar10 = '\x03';
LAB_0010913d:
          ra_insert_new_key_value_at(ra,~uVar12,key,c,uVar10);
        }
        else {
          uVar10 = (x1->high_low_container).typecodes[uVar6 & 0xffff];
          src = (array_container_t *)(x1->high_low_container).containers[uVar6 & 0xffff];
          if (uVar10 == '\x04') {
            uVar10 = *(uint8_t *)&src->array;
            src = *(array_container_t **)src;
          }
          local_40 = (run_container_t *)0x0;
          if (uVar10 == '\x03') {
            iVar8 = run_container_negation((run_container_t *)src,&local_40);
            uVar10 = (uint8_t)iVar8;
          }
          else if (uVar10 == '\x02') {
            local_40 = (run_container_t *)bitset_container_create();
            array_container_negation(src,(bitset_container_t *)local_40);
            uVar10 = '\x01';
          }
          else {
            _Var4 = bitset_container_negation((bitset_container_t *)src,&local_40);
            uVar10 = '\x02' - _Var4;
          }
          c = local_40;
          run = local_40;
          uVar5 = uVar10;
          if (uVar10 == '\x04') {
            uVar5 = *(uint8_t *)&local_40->runs;
            run = *(run_container_t **)local_40;
          }
          if (uVar5 == '\x03') {
            iVar8 = run_container_cardinality(run);
          }
          else {
            iVar8 = run->n_runs;
          }
          if (iVar8 != 0) goto LAB_0010913d;
          container_free(c,uVar10);
        }
        bVar15 = uVar14 != local_34;
        uVar14 = uVar14 + 1;
      } while (bVar15);
    }
    if ((range_end & 0xffff) != 0xffff) {
      hb = hb + 1;
      insert_flipped_container(ra,&x1->high_low_container,hb,0,(uint16_t)range_end);
    }
  }
  ra_append_copies_after(ra,&x1->high_low_container,hb,(_Bool)((x1->high_low_container).flags & 1));
  return (roaring_bitmap_t *)ra;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_flip_closed(const roaring_bitmap_t *x1,
                                             uint32_t range_start,
                                             uint32_t range_end) {
    if (range_start > range_end) {
        return roaring_bitmap_copy(x1);
    }

    roaring_bitmap_t *ans = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(ans, is_cow(x1));

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;  // & 0xFFFF;
    uint16_t hb_end = (uint16_t)(range_end >> 16);
    const uint16_t lb_end = (uint16_t)range_end;  // & 0xFFFF;

    ra_append_copies_until(&ans->high_low_container, &x1->high_low_container,
                           hb_start, is_cow(x1));
    if (hb_start == hb_end) {
        insert_flipped_container(&ans->high_low_container,
                                 &x1->high_low_container, hb_start, lb_start,
                                 lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_start,
                                     lb_start, 0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;  // later we'll handle the partial block

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            insert_fully_flipped_container(&ans->high_low_container,
                                           &x1->high_low_container,
                                           (uint16_t)hb);
        }

        // handle a partial final container
        if (lb_end != 0xFFFF) {
            insert_flipped_container(&ans->high_low_container,
                                     &x1->high_low_container, hb_end + 1, 0,
                                     lb_end);
            ++hb_end;
        }
    }
    ra_append_copies_after(&ans->high_low_container, &x1->high_low_container,
                           hb_end, is_cow(x1));
    return ans;
}